

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxmlparser.cpp
# Opt level: O0

void __thiscall
QDBusXmlParser::QDBusXmlParser
          (QDBusXmlParser *this,QString *service,QString *path,QString *xmlData,
          DiagnosticsReporter *reporter)

{
  byte bVar1;
  bool bVar2;
  undefined4 uVar3;
  Object *pOVar4;
  ulong uVar5;
  char *pcVar6;
  QString *in_RDI;
  Data *in_R8;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  int nodeLevel;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  Object *in_stack_fffffffffffffc48;
  Object *in_stack_fffffffffffffc50;
  Data *pDVar8;
  QDBusXmlParser *in_stack_fffffffffffffc58;
  char16_t **ppcVar9;
  QAnyStringView *in_stack_fffffffffffffc60;
  char16_t **in_stack_fffffffffffffc68;
  Data *in_stack_fffffffffffffc70;
  QDBusXmlParser *in_stack_fffffffffffffc78;
  QDBusXmlParser *this_00;
  QString local_308 [2];
  char local_2d8 [32];
  QString local_2b8 [2];
  QString local_288 [2];
  char local_258 [32];
  QString local_238 [2];
  undefined1 local_208 [16];
  QString local_1f8 [2];
  char local_1c8 [32];
  undefined1 local_1a8 [16];
  QString local_198 [2];
  QLatin1StringView local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  QString local_138 [2];
  char local_108 [32];
  undefined1 local_e8 [16];
  QString local_d8 [2];
  undefined1 local_a8 [16];
  QLatin1StringView local_98;
  undefined1 local_88 [16];
  QLatin1StringView local_78;
  undefined1 local_68 [16];
  QAnyStringView *local_58;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)in_stack_fffffffffffffc50,(QString *)in_stack_fffffffffffffc48);
  QString::QString((QString *)in_stack_fffffffffffffc50,(QString *)in_stack_fffffffffffffc48);
  operator_new(0x78);
  QDBusIntrospection::Object::Object(in_stack_fffffffffffffc50);
  QSharedDataPointer<QDBusIntrospection::Object>::QSharedDataPointer
            ((QSharedDataPointer<QDBusIntrospection::Object> *)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48);
  std::unique_ptr<QDBusIntrospection::Interface,std::default_delete<QDBusIntrospection::Interface>>
  ::unique_ptr<std::default_delete<QDBusIntrospection::Interface>,void>
            ((unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
              *)in_stack_fffffffffffffc50);
  QMap<QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>::QMap
            ((QMap<QString,_QSharedDataPointer<QDBusIntrospection::Interface>_> *)0x243ad4);
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffc60,&in_stack_fffffffffffffc58->m_service);
  QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)(in_RDI + 3),local_58);
  QDBusIntrospection::SourceLocation::SourceLocation((SourceLocation *)&in_RDI[3].d.ptr);
  in_RDI[4].d.d = in_R8;
  pOVar4 = QSharedDataPointer<QDBusIntrospection::Object>::operator->
                     ((QSharedDataPointer<QDBusIntrospection::Object> *)in_stack_fffffffffffffc50);
  QString::operator=(&pOVar4->service,in_RDI);
  this_00 = (QDBusXmlParser *)(in_RDI + 1);
  pOVar4 = QSharedDataPointer<QDBusIntrospection::Object>::operator->
                     ((QSharedDataPointer<QDBusIntrospection::Object> *)in_stack_fffffffffffffc50);
  QString::operator=(&pOVar4->path,&this_00->m_service);
LAB_00243b80:
  bVar1 = QXmlStreamReader::atEnd();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    bVar2 = QXmlStreamReader::hasError((QXmlStreamReader *)0x2442fe);
    if (bVar2) {
      if (in_RDI[4].d.d == (Data *)0x0) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::dbusParser();
        anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffc50,
                   (QLoggingCategory *)in_stack_fffffffffffffc48);
        while( true ) {
          bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_48);
          if (!bVar2) break;
          anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x244400);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                     (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                     (char *)in_stack_fffffffffffffc48,(char *)0x244419);
          QXmlStreamReader::errorString();
          QtPrivate::asString(local_308);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffffc68);
          pcVar6 = QByteArray::constData((QByteArray *)0x244459);
          QMessageLogger::debug(local_2d8,"Error: XML error: %s",pcVar6);
          QByteArray::~QByteArray((QByteArray *)0x24447f);
          QString::~QString((QString *)0x24448c);
          local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
        }
      }
      else {
        pDVar8 = in_RDI[4].d.d;
        ppcVar9 = &in_RDI[3].d.ptr;
        QXmlStreamReader::errorString();
        QtPrivate::asString(local_2b8);
        QString::toLocal8Bit((QString *)in_stack_fffffffffffffc68);
        pcVar6 = QByteArray::constData((QByteArray *)0x24436e);
        (**(code **)(*(long *)&pDVar8->super_QArrayData + 0x18))
                  (pDVar8,ppcVar9,"XML error: %s\n",pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x244398);
        QString::~QString((QString *)0x2443a5);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
      __stack_chk_fail();
    }
    return;
  }
  updateCurrentLocation(in_stack_fffffffffffffc58);
  QXmlStreamReader::readNext();
  uVar3 = QXmlStreamReader::tokenType();
  switch(uVar3) {
  case 2:
  case 3:
  case 8:
    goto LAB_00243b80;
  case 4:
    auVar7 = QXmlStreamReader::name();
    local_68 = auVar7;
    local_78 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
    bVar2 = ::operator==((QStringView *)in_stack_fffffffffffffc50,
                         (QLatin1StringView *)in_stack_fffffffffffffc48);
    if (bVar2) {
      readNode(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    }
    else {
      auVar7 = QXmlStreamReader::name();
      local_88 = auVar7;
      local_98 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
      bVar2 = ::operator==((QStringView *)in_stack_fffffffffffffc50,
                           (QLatin1StringView *)in_stack_fffffffffffffc48);
      if (bVar2) {
        readInterface(this_00);
      }
      else {
        auVar7 = QXmlStreamReader::prefix();
        local_a8 = auVar7;
        bVar2 = QStringView::isEmpty((QStringView *)0x243cf7);
        if (bVar2) {
          if (in_RDI[4].d.d == (Data *)0x0) {
            local_18 = &DAT_aaaaaaaaaaaaaaaa;
            local_10 = &DAT_aaaaaaaaaaaaaaaa;
            QtPrivateLogging::dbusParser();
            anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffc50,
                       (QLoggingCategory *)in_stack_fffffffffffffc48);
            while( true ) {
              bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                ((QLoggingCategoryMacroHolder *)&local_18);
              if (!bVar2) break;
              anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x243e16);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffffc60,
                         (char *)in_stack_fffffffffffffc58,
                         (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                         (char *)in_stack_fffffffffffffc48,(char *)0x243e2f);
              auVar7 = QXmlStreamReader::name();
              local_148 = auVar7;
              QStringView::toString((QStringView *)in_stack_fffffffffffffc50);
              QtPrivate::asString(local_138);
              QString::toLocal8Bit((QString *)in_stack_fffffffffffffc68);
              pcVar6 = QByteArray::constData((QByteArray *)0x243e8c);
              QMessageLogger::debug(local_108,"Warning: Skipping unknown element \'%s\'",pcVar6);
              QByteArray::~QByteArray((QByteArray *)0x243eb2);
              QString::~QString((QString *)0x243ebf);
              local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
            }
          }
          else {
            pDVar8 = in_RDI[4].d.d;
            auVar7 = QXmlStreamReader::name();
            local_e8 = auVar7;
            QStringView::toString((QStringView *)in_stack_fffffffffffffc50);
            QtPrivate::asString(local_d8);
            QString::toLocal8Bit((QString *)in_stack_fffffffffffffc68);
            pcVar6 = QByteArray::constData((QByteArray *)0x243d84);
            (**(code **)(*(long *)&pDVar8->super_QArrayData + 0x10))
                      (pDVar8,&in_RDI[3].d.ptr,"Skipping unknown element \'%s\'\n",pcVar6);
            QByteArray::~QByteArray((QByteArray *)0x243dae);
            QString::~QString((QString *)0x243dbb);
          }
        }
        QXmlStreamReader::skipCurrentElement();
      }
    }
    goto LAB_00243b80;
  case 5:
    auVar7 = QXmlStreamReader::name();
    local_158 = auVar7;
    local_168 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
    bVar2 = ::operator==((QStringView *)in_stack_fffffffffffffc50,
                         (QLatin1StringView *)in_stack_fffffffffffffc48);
    if (!bVar2) {
      if (in_RDI[4].d.d == (Data *)0x0) {
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::dbusParser();
        anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffc50,
                   (QLoggingCategory *)in_stack_fffffffffffffc48);
        while( true ) {
          bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_28);
          if (!bVar2) break;
          anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x24406d);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                     (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                     (char *)in_stack_fffffffffffffc48,(char *)0x244086);
          auVar7 = QXmlStreamReader::name();
          local_208 = auVar7;
          QStringView::toString((QStringView *)in_stack_fffffffffffffc50);
          QtPrivate::asString(local_1f8);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffffc68);
          pcVar6 = QByteArray::constData((QByteArray *)0x2440e3);
          QMessageLogger::debug(local_1c8,"Error: Invalid node declaration \'%s\'",pcVar6);
          QByteArray::~QByteArray((QByteArray *)0x244109);
          QString::~QString((QString *)0x244116);
          local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
        }
      }
      else {
        in_stack_fffffffffffffc70 = in_RDI[4].d.d;
        in_stack_fffffffffffffc78 = (QDBusXmlParser *)&in_RDI[3].d.ptr;
        auVar7 = QXmlStreamReader::name();
        local_1a8 = auVar7;
        QStringView::toString((QStringView *)in_stack_fffffffffffffc50);
        QtPrivate::asString(local_198);
        QString::toLocal8Bit((QString *)in_stack_fffffffffffffc68);
        pcVar6 = QByteArray::constData((QByteArray *)0x243fdb);
        (**(code **)(*(long *)&in_stack_fffffffffffffc70->super_QArrayData + 0x18))
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,
                   "Invalid node declaration \'%s\'\n",pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x244005);
        QString::~QString((QString *)0x244012);
      }
    }
    goto LAB_00243b80;
  case 6:
    uVar5 = QXmlStreamReader::isWhitespace();
    if ((uVar5 & 1) != 0) goto LAB_00243b80;
    break;
  case 7:
    goto switchD_00243be6_caseD_7;
  }
  if (in_RDI[4].d.d == (Data *)0x0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::dbusParser();
    anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffc50,
               (QLoggingCategory *)in_stack_fffffffffffffc48);
    while( true ) {
      bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_38);
      if (!bVar2) break;
      anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x24424c);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                 (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(char *)in_stack_fffffffffffffc48,
                 (char *)0x244265);
      QXmlStreamReader::tokenString();
      QtPrivate::asString(local_288);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffffc68);
      pcVar6 = QByteArray::constData((QByteArray *)0x2442a5);
      QMessageLogger::debug(local_258,"Error: Unknown token: \'%s\'",pcVar6);
      QByteArray::~QByteArray((QByteArray *)0x2442cb);
      QString::~QString((QString *)0x2442d8);
      local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
    }
  }
  else {
    in_stack_fffffffffffffc60 = (QAnyStringView *)in_RDI[4].d.d;
    in_stack_fffffffffffffc68 = &in_RDI[3].d.ptr;
    QXmlStreamReader::tokenString();
    QtPrivate::asString(local_238);
    QString::toLocal8Bit((QString *)in_stack_fffffffffffffc68);
    pcVar6 = QByteArray::constData((QByteArray *)0x2441ba);
    (**(code **)((long)(in_stack_fffffffffffffc60->field_0).m_data + 0x18))
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc68,"Unknown token: \'%s\'\n",pcVar6)
    ;
    QByteArray::~QByteArray((QByteArray *)0x2441e4);
    QString::~QString((QString *)0x2441f1);
  }
  goto LAB_00243b80;
switchD_00243be6_caseD_7:
  goto LAB_00243b80;
}

Assistant:

QDBusXmlParser::QDBusXmlParser(const QString &service, const QString &path, const QString &xmlData,
                               QDBusIntrospection::DiagnosticsReporter *reporter)
    : m_service(service),
      m_path(path),
      m_object(new QDBusIntrospection::Object),
      m_xml(xmlData),
      m_reporter(reporter)
{
    m_object->service = m_service;
    m_object->path = m_path;

    int nodeLevel = -1;

    while (!m_xml.atEnd()) {
        updateCurrentLocation();
        m_xml.readNext();

        switch (m_xml.tokenType()) {
        case QXmlStreamReader::StartElement:
            if (m_xml.name() == "node"_L1) {
                readNode(++nodeLevel);
            } else if (m_xml.name() == "interface"_L1) {
                readInterface();
            } else {
                if (m_xml.prefix().isEmpty()) {
                    qDBusParserWarning("Skipping unknown element '%s'",
                                       qPrintable(m_xml.name().toString()));
                }
                m_xml.skipCurrentElement();
            }
            break;
        case QXmlStreamReader::EndElement:
            if (m_xml.name() == "node"_L1) {
                --nodeLevel;
            } else {
                qDBusParserError("Invalid node declaration '%s'",
                                 qPrintable(m_xml.name().toString()));
            }
            break;
        case QXmlStreamReader::StartDocument:
        case QXmlStreamReader::EndDocument:
        case QXmlStreamReader::DTD:
            // not interested
            break;
        case QXmlStreamReader::Comment:
            // ignore comments and processing instructions
            break;
        case QXmlStreamReader::Characters:
            // ignore whitespace
            if (m_xml.isWhitespace())
                break;
            Q_FALLTHROUGH();
        default:
            qDBusParserError("Unknown token: '%s'", qPrintable(m_xml.tokenString()));
            break;
        }
    }

    if (m_xml.hasError())
        qDBusParserError("XML error: %s", qPrintable(m_xml.errorString()));
}